

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_27f4c0::PeerManagerImpl::RemoveBlockRequest
          (PeerManagerImpl *this,uint256 *hash,optional<long> from_peer)

{
  size_t *psVar1;
  long lVar2;
  _Base_ptr p_Var3;
  CNodeState *pCVar4;
  _Rb_tree_header *p_Var5;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  __position;
  time_point tVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  long lVar9;
  _Self __tmp;
  char *in_R8;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  pVar10;
  CNodeState *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pVar10 = std::
           multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
           ::equal_range(&this->mapBlocksInFlight,hash);
  __position = pVar10.first._M_node;
  if (__position._M_node != pVar10.second._M_node._M_node) {
    p_Var5 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
    do {
      lVar2 = *(long *)(__position._M_node + 2);
      p_Var3 = __position._M_node[2]._M_parent;
      if ((((undefined1  [16])
            from_peer.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
         (lVar2 == from_peer.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_payload)) {
        p_Var8 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = &p_Var5->_M_header;
        if (p_Var8 == (_Base_ptr)0x0) {
LAB_001d7577:
          local_40 = (CNodeState *)0x0;
        }
        else {
          do {
            if (lVar2 <= (long)*(size_t *)(p_Var8 + 1)) {
              p_Var7 = p_Var8;
            }
            p_Var8 = (&p_Var8->_M_left)[(long)*(size_t *)(p_Var8 + 1) < lVar2];
          } while (p_Var8 != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var7 == p_Var5) goto LAB_001d7577;
          local_40 = (CNodeState *)0x0;
          if ((long)((_Rb_tree_header *)p_Var7)->_M_node_count <= lVar2) {
            local_40 = (CNodeState *)((long)p_Var7 + 0x28);
          }
        }
        inline_assertion_check<true,(anonymous_namespace)::CNodeState*>
                  (&local_40,(char *)0x52f,0x7d3ff7,"State(node_id)",in_R8);
        pCVar4 = local_40;
        if ((_Base_ptr)
            (local_40->vBlocksInFlight).
            super__List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
            ._M_impl._M_node.super__List_node_base._M_next == p_Var3) {
          tVar6 = NodeClock::now();
          lVar2 = (pCVar4->m_downloading_since).__r;
          lVar9 = (long)tVar6.__d.__r / 1000;
          if ((long)tVar6.__d.__r / 1000 < lVar2) {
            lVar9 = lVar2;
          }
          (pCVar4->m_downloading_since).__r = lVar9;
        }
        psVar1 = &(pCVar4->vBlocksInFlight).
                  super__List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        if ((PartiallyDownloadedBlock *)p_Var3->_M_right != (PartiallyDownloadedBlock *)0x0) {
          std::default_delete<PartiallyDownloadedBlock>::operator()
                    ((default_delete<PartiallyDownloadedBlock> *)&p_Var3->_M_right,
                     (PartiallyDownloadedBlock *)p_Var3->_M_right);
        }
        p_Var3->_M_right = (_Base_ptr)0x0;
        operator_delete(p_Var3,0x20);
        if ((pCVar4->vBlocksInFlight).
            super__List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
            ._M_impl._M_node.super__List_node_base._M_next ==
            (_List_node_base *)&pCVar4->vBlocksInFlight) {
          this->m_peers_downloading_from = this->m_peers_downloading_from + -1;
        }
        (pCVar4->m_stalling_since).__r = 0;
        __position._M_node =
             (_Base_ptr)
             std::
             multimap<uint256,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
             ::erase_abi_cxx11_((multimap<uint256,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
                                 *)&this->mapBlocksInFlight,__position._M_node);
      }
      else {
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
    } while (__position._M_node != pVar10.second._M_node._M_node);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::RemoveBlockRequest(const uint256& hash, std::optional<NodeId> from_peer)
{
    auto range = mapBlocksInFlight.equal_range(hash);
    if (range.first == range.second) {
        // Block was not requested from any peer
        return;
    }

    // We should not have requested too many of this block
    Assume(mapBlocksInFlight.count(hash) <= MAX_CMPCTBLOCKS_INFLIGHT_PER_BLOCK);

    while (range.first != range.second) {
        auto [node_id, list_it] = range.first->second;

        if (from_peer && *from_peer != node_id) {
            range.first++;
            continue;
        }

        CNodeState& state = *Assert(State(node_id));

        if (state.vBlocksInFlight.begin() == list_it) {
            // First block on the queue was received, update the start download time for the next one
            state.m_downloading_since = std::max(state.m_downloading_since, GetTime<std::chrono::microseconds>());
        }
        state.vBlocksInFlight.erase(list_it);

        if (state.vBlocksInFlight.empty()) {
            // Last validated block on the queue for this peer was received.
            m_peers_downloading_from--;
        }
        state.m_stalling_since = 0us;

        range.first = mapBlocksInFlight.erase(range.first);
    }
}